

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O3

int Saig_ManSimDataInit(Aig_Man_t *p,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo,Vec_Int_t *vRes)

{
  int iVar1;
  void **ppvVar2;
  int *piVar3;
  Aig_Obj_t *pObj;
  void *pvVar4;
  bool bVar5;
  Vec_Ptr_t *pVVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint *pInfo_3;
  uint *pInfo_2;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint local_44;
  
  if (p->nRegs < 1) {
    local_44 = 0;
  }
  else {
    pVVar6 = p->vCis;
    local_44 = 0;
    do {
      uVar9 = p->nTruePis + local_44;
      if (((int)uVar9 < 0) || (pVVar6->nSize <= (int)uVar9)) goto LAB_006170fa;
      uVar10 = local_44 >> 5;
      uVar16 = local_44 & 0x1f;
      iVar13 = *(int *)((long)pVVar6->pArray[uVar9] + 0x24);
      if (((long)iVar13 < 0) || (vSimInfo->nSize <= iVar13)) goto LAB_006170fa;
      local_44 = local_44 + 1;
      *(uint *)vSimInfo->pArray[iVar13] =
           *vSimInfo->pArray[iVar13] & 0xfffffffc |
           (((uint)(&pCex[1].iPo)[uVar10] >> uVar16 & 1) != 0) + 1;
    } while ((int)local_44 < p->nRegs);
  }
  if (pCex->iFrame < 0) {
    pVVar6 = p->vCos;
    uVar9 = pCex->iFrame;
  }
  else {
    uVar16 = 0;
    do {
      iVar13 = p->pConst1->Id;
      if (((long)iVar13 < 0) || (vSimInfo->nSize <= iVar13)) goto LAB_006170fa;
      ppvVar2 = vSimInfo->pArray;
      uVar15 = (ulong)(uVar16 >> 4);
      uVar9 = *(uint *)((long)ppvVar2[iVar13] + uVar15 * 4);
      bVar7 = (char)uVar16 * '\x02' & 0x1e;
      *(uint *)((long)ppvVar2[iVar13] + uVar15 * 4) = (uVar9 >> bVar7 & 3 ^ 2) << bVar7 ^ uVar9;
      if (0 < p->nTruePis) {
        pVVar6 = p->vCis;
        lVar11 = 0;
        do {
          if (pVVar6->nSize <= lVar11) goto LAB_006170fa;
          uVar9 = local_44 + (int)lVar11;
          iVar13 = *(int *)((long)pVVar6->pArray[lVar11] + 0x24);
          if (((long)iVar13 < 0) || (vSimInfo->nSize <= iVar13)) goto LAB_006170fa;
          uVar10 = *(uint *)((long)ppvVar2[iVar13] + uVar15 * 4);
          *(uint *)((long)ppvVar2[iVar13] + uVar15 * 4) =
               (uVar10 >> bVar7 & 3 ^
               (((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0) + 1) << bVar7 ^
               uVar10;
          lVar11 = lVar11 + 1;
        } while (lVar11 < p->nTruePis);
        local_44 = local_44 + (int)lVar11;
      }
      if ((vRes != (Vec_Int_t *)0x0) && (0 < vRes->nSize)) {
        piVar3 = vRes->pArray;
        pVVar6 = p->vCis;
        lVar11 = 0;
        do {
          iVar13 = piVar3[lVar11];
          if (((long)iVar13 < 0) || (pVVar6->nSize <= iVar13)) goto LAB_006170fa;
          iVar13 = *(int *)((long)pVVar6->pArray[iVar13] + 0x24);
          if (((long)iVar13 < 0) || (vSimInfo->nSize <= iVar13)) goto LAB_006170fa;
          uVar9 = *(uint *)((long)ppvVar2[iVar13] + uVar15 * 4);
          *(uint *)((long)ppvVar2[iVar13] + uVar15 * 4) = (~(uVar9 >> bVar7) & 3) << bVar7 ^ uVar9;
          lVar11 = lVar11 + 1;
        } while (lVar11 < vRes->nSize);
      }
      pVVar6 = p->vObjs;
      if (0 < pVVar6->nSize) {
        lVar11 = 0;
        do {
          pObj = (Aig_Obj_t *)pVVar6->pArray[lVar11];
          if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
            Saig_ManExtendOneEval(vSimInfo,pObj,uVar16);
            pVVar6 = p->vObjs;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar6->nSize);
      }
      pVVar6 = p->vCos;
      if (0 < pVVar6->nSize) {
        lVar11 = 0;
        do {
          Saig_ManExtendOneEval(vSimInfo,(Aig_Obj_t *)pVVar6->pArray[lVar11],uVar16);
          lVar11 = lVar11 + 1;
          pVVar6 = p->vCos;
        } while (lVar11 < pVVar6->nSize);
      }
      uVar9 = uVar16;
      if (uVar16 == pCex->iFrame) break;
      uVar9 = pCex->iFrame;
      if (0 < p->nRegs) {
        uVar12 = (ulong)(uVar16 + 1 >> 4);
        bVar8 = (char)uVar16 * '\x02' + 2U & 0x1e;
        iVar13 = 0;
        do {
          uVar9 = p->nTruePos + iVar13;
          if (((((int)uVar9 < 0) || (pVVar6->nSize <= (int)uVar9)) ||
              (uVar10 = p->nTruePis + iVar13, (int)uVar10 < 0)) || (p->vCis->nSize <= (int)uVar10))
          goto LAB_006170fa;
          iVar1 = *(int *)((long)pVVar6->pArray[uVar9] + 0x24);
          if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006170fa;
          uVar14 = *(uint *)((long)vSimInfo->pArray[iVar1] + uVar15 * 4) >> bVar7;
          uVar9 = *(uint *)((long)p->vCis->pArray[uVar10] + 0x24);
          if (((long)(int)uVar9 < 0) || ((uint)vSimInfo->nSize <= uVar9)) goto LAB_006170fa;
          if ((uVar14 & 3) == 0) {
            __assert_fail("Value >= SAIG_ZER && Value <= SAIG_UND",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                          ,0x3d,"void Saig_ManSimInfoSet(Vec_Ptr_t *, Aig_Obj_t *, int, int)");
          }
          pvVar4 = vSimInfo->pArray[(int)uVar9];
          uVar9 = *(uint *)((long)pvVar4 + uVar12 * 4);
          *(uint *)((long)pvVar4 + uVar12 * 4) = ((uVar9 >> bVar8 ^ uVar14) & 3) << bVar8 ^ uVar9;
          iVar13 = iVar13 + 1;
        } while (iVar13 < p->nRegs);
        uVar9 = pCex->iFrame;
      }
      bVar5 = (int)uVar16 < (int)uVar9;
      uVar16 = uVar16 + 1;
    } while (bVar5);
  }
  iVar13 = pCex->iPo;
  if ((-1 < (long)iVar13) && (iVar13 < pVVar6->nSize)) {
    iVar13 = *(int *)((long)pVVar6->pArray[iVar13] + 0x24);
    if ((-1 < (long)iVar13) && (iVar13 < vSimInfo->nSize)) {
      return *(uint *)((long)vSimInfo->pArray[iVar13] + (long)((int)uVar9 >> 4) * 4) >>
             ((char)uVar9 * '\x02' & 0x1fU) & 3;
    }
  }
LAB_006170fa:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManSimDataInit( Aig_Man_t * p, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo, Vec_Int_t * vRes )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f, Entry, iBit = 0;
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSimInfoSet( vSimInfo, pObj, 0, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE:SAIG_ZER );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Saig_ManSimInfoSet( vSimInfo, Aig_ManConst1(p), f, SAIG_ONE );
        Saig_ManForEachPi( p, pObj, i )
            Saig_ManSimInfoSet( vSimInfo, pObj, f, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE:SAIG_ZER );
        if ( vRes )
        Vec_IntForEachEntry( vRes, Entry, i )
            Saig_ManSimInfoSet( vSimInfo, Aig_ManCi(p, Entry), f, SAIG_UND );
        Aig_ManForEachNode( p, pObj, i )
            Saig_ManExtendOneEval( vSimInfo, pObj, f );
        Aig_ManForEachCo( p, pObj, i )
            Saig_ManExtendOneEval( vSimInfo, pObj, f );
        if ( f == pCex->iFrame )
            break;
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Saig_ManSimInfoSet( vSimInfo, pObjLo, f+1, Saig_ManSimInfoGet(vSimInfo, pObjLi, f) );
    }
    // make sure the output of the property failed
    pObj = Aig_ManCo( p, pCex->iPo );
    return Saig_ManSimInfoGet( vSimInfo, pObj, pCex->iFrame );
}